

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

bool __thiscall
nanoflann::KNNResultSet<double,_unsigned_long,_unsigned_long>::addPoint
          (KNNResultSet<double,_unsigned_long,_unsigned_long> *this,DistanceType_conflict dist,
          IndexType index)

{
  IndexType *pIVar1;
  DistanceType_conflict *pDVar2;
  ulong uVar3;
  CountType CVar4;
  CountType CVar5;
  
  pIVar1 = this->indices;
  pDVar2 = this->dists;
  CVar4 = this->count;
  while (uVar3 = CVar4, CVar4 = uVar3 - 1, uVar3 != 0) {
    CVar5 = this->capacity;
    if (pDVar2[CVar4] <= dist) goto LAB_001656e0;
    if (uVar3 < CVar5) {
      pDVar2[uVar3] = pDVar2[CVar4];
      pIVar1[uVar3] = pIVar1[CVar4];
    }
  }
  CVar5 = this->capacity;
LAB_001656e0:
  if (uVar3 < CVar5) {
    pDVar2[uVar3] = dist;
    pIVar1[uVar3] = index;
    CVar5 = this->capacity;
  }
  if (this->count < CVar5) {
    this->count = this->count + 1;
  }
  return true;
}

Assistant:

inline bool addPoint(DistanceType dist, IndexType index)
    {
        CountType i;
        for (i = count; i > 0; --i)
        {
#ifdef NANOFLANN_FIRST_MATCH  // If defined and two points have the same
                              // distance, the one with the lowest-index will be
                              // returned first.
            if ((dists[i - 1] > dist) ||
                ((dist == dists[i - 1]) && (indices[i - 1] > index)))
            {
#else
            if (dists[i - 1] > dist)
            {
#endif
                if (i < capacity)
                {
                    dists[i]   = dists[i - 1];
                    indices[i] = indices[i - 1];
                }
            }
            else
                break;
        }
        if (i < capacity)
        {
            dists[i]   = dist;
            indices[i] = index;
        }
        if (count < capacity) count++;

        // tell caller that the search shall continue
        return true;
    }

    inline DistanceType worstDist() const { return dists[capacity - 1]; }
}